

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlBufferResize(xmlBufferPtr buf,uint size)

{
  size_t sVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  uint local_44;
  uint local_40;
  uint local_3c;
  size_t start_buf;
  xmlChar *rebuf;
  uint newSize;
  uint size_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = 0;
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf_local._4_4_ = 0;
  }
  else if (size < buf->size) {
    buf_local._4_4_ = 1;
  }
  else if (size < 0xfffffff6) {
    switch(buf->alloc) {
    case XML_BUFFER_ALLOC_DOUBLEIT:
    case XML_BUFFER_ALLOC_IO:
      if (buf->size == 0) {
        if (size < 0xfffffff6) {
          local_3c = size + 10;
        }
        else {
          local_3c = 0xffffffff;
        }
        rebuf._0_4_ = local_3c;
      }
      else {
        rebuf._0_4_ = buf->size;
      }
      for (; (uint)rebuf < size; rebuf._0_4_ = (uint)rebuf << 1) {
        if (0x7fffffff < (uint)rebuf) {
          xmlTreeErrMemory("growing buffer");
          return 0;
        }
      }
      break;
    case XML_BUFFER_ALLOC_EXACT:
      if (size < 0xfffffff6) {
        local_40 = size + 10;
      }
      else {
        local_40 = 0xffffffff;
      }
      rebuf._0_4_ = local_40;
      break;
    default:
      if (size < 0xfffffff6) {
        local_44 = size + 10;
      }
      else {
        local_44 = 0xffffffff;
      }
      rebuf._0_4_ = local_44;
      break;
    case XML_BUFFER_ALLOC_HYBRID:
      rebuf._0_4_ = size;
      if (0xfff < buf->use) {
        for (rebuf._0_4_ = buf->size; (uint)rebuf < size; rebuf._0_4_ = (uint)rebuf << 1) {
          if (0x7fffffff < (uint)rebuf) {
            xmlTreeErrMemory("growing buffer");
            return 0;
          }
        }
      }
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != (xmlChar *)0x0)) {
      uVar2 = (long)buf->content - (long)buf->contentIO;
      if ((uint)rebuf < uVar2) {
        memmove(buf->contentIO,buf->content,(ulong)buf->use);
        buf->content = buf->contentIO;
        buf->content[buf->use] = '\0';
        buf->size = buf->size + (int)uVar2;
      }
      else {
        pxVar3 = (xmlChar *)(*xmlRealloc)(buf->contentIO,uVar2 + (uint)rebuf);
        if (pxVar3 == (xmlChar *)0x0) {
          xmlTreeErrMemory("growing buffer");
          return 0;
        }
        buf->contentIO = pxVar3;
        buf->content = pxVar3 + uVar2;
      }
    }
    else {
      sVar1 = (size_t)(uint)rebuf;
      if (buf->content == (xmlChar *)0x0) {
        start_buf = (size_t)(*xmlMallocAtomic)(sVar1);
        buf->use = 0;
        *(undefined1 *)(start_buf + buf->use) = 0;
      }
      else if (buf->size - buf->use < 100) {
        start_buf = (size_t)(*xmlRealloc)(buf->content,sVar1);
      }
      else {
        start_buf = (size_t)(*xmlMallocAtomic)(sVar1);
        if ((void *)start_buf != (void *)0x0) {
          memcpy((void *)start_buf,buf->content,(ulong)buf->use);
          (*xmlFree)(buf->content);
          *(undefined1 *)(start_buf + buf->use) = 0;
        }
      }
      if (start_buf == 0) {
        xmlTreeErrMemory("growing buffer");
        return 0;
      }
      buf->content = (xmlChar *)start_buf;
    }
    buf->size = (uint)rebuf;
    buf_local._4_4_ = 1;
  }
  else {
    xmlTreeErrMemory("growing buffer past UINT_MAX");
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferResize(xmlBufferPtr buf, unsigned int size)
{
    unsigned int newSize;
    xmlChar* rebuf = NULL;
    size_t start_buf;

    if (buf == NULL)
        return(0);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);

    /* Don't resize if we don't have to */
    if (size < buf->size)
        return 1;

    if (size > UINT_MAX - 10) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return 0;
    }

    /* figure out new size */
    switch (buf->alloc){
	case XML_BUFFER_ALLOC_IO:
	case XML_BUFFER_ALLOC_DOUBLEIT:
	    /*take care of empty case*/
            if (buf->size == 0)
                newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
            else
                newSize = buf->size;
	    while (size > newSize) {
	        if (newSize > UINT_MAX / 2) {
	            xmlTreeErrMemory("growing buffer");
	            return 0;
	        }
	        newSize *= 2;
	    }
	    break;
	case XML_BUFFER_ALLOC_EXACT:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
        case XML_BUFFER_ALLOC_HYBRID:
            if (buf->use < BASE_BUFFER_SIZE)
                newSize = size;
            else {
                newSize = buf->size;
                while (size > newSize) {
                    if (newSize > UINT_MAX / 2) {
                        xmlTreeErrMemory("growing buffer");
                        return 0;
                    }
                    newSize *= 2;
                }
            }
            break;

	default:
	    newSize = (size > UINT_MAX - 10 ? UINT_MAX : size + 10);
	    break;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        start_buf = buf->content - buf->contentIO;

        if (start_buf > newSize) {
	    /* move data back to start */
	    memmove(buf->contentIO, buf->content, buf->use);
	    buf->content = buf->contentIO;
	    buf->content[buf->use] = 0;
	    buf->size += start_buf;
	} else {
	    rebuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + newSize);
	    if (rebuf == NULL) {
		xmlTreeErrMemory("growing buffer");
		return 0;
	    }
	    buf->contentIO = rebuf;
	    buf->content = rebuf + start_buf;
	}
    } else {
	if (buf->content == NULL) {
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    buf->use = 0;
	    rebuf[buf->use] = 0;
	} else if (buf->size - buf->use < 100) {
	    rebuf = (xmlChar *) xmlRealloc(buf->content, newSize);
        } else {
	    /*
	     * if we are reallocating a buffer far from being full, it's
	     * better to make a new allocation and copy only the used range
	     * and free the old one.
	     */
	    rebuf = (xmlChar *) xmlMallocAtomic(newSize);
	    if (rebuf != NULL) {
		memcpy(rebuf, buf->content, buf->use);
		xmlFree(buf->content);
		rebuf[buf->use] = 0;
	    }
	}
	if (rebuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return 0;
	}
	buf->content = rebuf;
    }
    buf->size = newSize;

    return 1;
}